

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationDerivateCase::iterate
          (HelperInvocationDerivateCase *this)

{
  int *value;
  ostringstream *poVar1;
  RenderContext *renderCtx;
  TestLog *pTVar2;
  FboHelper *this_00;
  bool bVar3;
  HelperInvocationDerivateCase *pHVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  int iVar9;
  undefined4 extraout_var;
  int iVar10;
  PixelBufferAccess *dst;
  Surface *pSVar11;
  int y_00;
  uint uVar12;
  void *__buf;
  void *__buf_00;
  int dy;
  ulong uVar13;
  int dx;
  bool bVar14;
  int iVar15;
  RGBA a;
  int y;
  int iVar16;
  allocator<char> local_2a4;
  byte local_2a3;
  byte local_2a2;
  allocator<char> local_2a1;
  HelperInvocationDerivateCase *local_2a0;
  int local_298;
  RGBA local_294;
  TestLog *local_290;
  Surface result;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  deUint32 local_220;
  int local_21c;
  uint local_218;
  int local_214;
  int local_210;
  int local_20c;
  int *local_208;
  int *local_200;
  ulong local_1f8;
  Random rnd;
  string sectionName;
  MessageBuilder local_1b0;
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"Iteration ",&local_2a4);
  section.m_log._0_4_ = this->m_iterNdx + 1;
  local_2a0 = this;
  de::toString<int>((string *)&result,(int *)&section);
  std::operator+(&local_240,&local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                 &local_240," / ");
  value = &local_2a0->m_numIters;
  de::toString<int>((string *)&rnd,value);
  local_200 = value;
  std::operator+(&sectionName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd);
  std::__cxx11::string::~string((string *)&rnd);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&local_260);
  pHVar4 = local_2a0;
  pTVar2 = ((local_2a0->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Iter",(allocator<char> *)&result);
  local_208 = &pHVar4->m_iterNdx;
  de::toString<int>(&local_260,local_208);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                 &local_240,&local_260);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_1b0,&sectionName);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  dVar7 = deStringHash((local_2a0->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus.
                       _M_p);
  dVar8 = deInt32Hash(*local_208);
  deRandom_init(&rnd.m_rnd,dVar7 ^ dVar8);
  tcu::Surface::Surface(&result,0x100,0x100);
  FboHelper::bindForRendering
            ((local_2a0->m_fbo).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
             .m_data.ptr);
  (**(code **)(CONCAT44(extraout_var,iVar6) + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(CONCAT44(extraout_var,iVar6) + 0x188))(0x4000);
  dst = (PixelBufferAccess *)0x1;
  drawRandomPrimitives
            (renderCtx,
             (((local_2a0->m_program).
               super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.
              ptr)->m_program).m_program,local_2a0->m_primitiveType,1,&rnd);
  pHVar4 = local_2a0;
  this_00 = (local_2a0->m_fbo).
            super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
            .m_data.ptr;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&result);
  FboHelper::readPixels(this_00,(int)&local_1b0,y_00,dst);
  uVar12 = 0xfe01;
  if (pHVar4->m_numSamples == 0) {
    uVar12 = 0x101;
  }
  local_290 = ((pHVar4->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_294.m_value = uVar12 + 0x1000000;
  local_1f8 = (ulong)(uVar12 | 0x1ff0000);
  iVar15 = 0;
  iVar6 = 0;
  uVar13 = 0;
  for (iVar16 = 0; iVar16 < result.m_height; iVar16 = iVar16 + 1) {
    iVar10 = 0;
    while (iVar10 < result.m_width) {
      a.m_value = *(deUint32 *)
                   ((long)result.m_pixels.m_ptr + (long)(result.m_width * iVar16 + iVar10) * 4);
      local_298 = iVar10;
      local_2a2 = tcu::compareThreshold(a,(RGBA)0xff000000,local_294);
      local_2a3 = tcu::compareThreshold(a,(RGBA)0xff00ff00,(RGBA)(deUint32)local_1f8);
      if ((a.m_value & 0xff0000) == 0) {
        bVar14 = false;
      }
      else {
        local_218 = (uint)uVar13;
        local_210 = result.m_width;
        local_20c = result.m_height;
        iVar10 = -1;
        local_220 = a.m_value;
        local_21c = iVar15;
        local_214 = iVar6;
        while( true ) {
          bVar14 = iVar10 != 2;
          if (iVar10 == 2) break;
          iVar15 = iVar10 + local_298;
          bVar3 = local_210 <= iVar15;
          for (iVar6 = -1; iVar6 != 2; iVar6 = iVar6 + 1) {
            if (iVar6 != 0 || iVar10 != 0) {
              if (((bVar3 || iVar15 < 0) || (iVar9 = iVar16 + iVar6, iVar9 < 0)) ||
                 (local_20c <= iVar9)) goto LAB_00592da2;
              bVar5 = tcu::compareThreshold
                                ((RGBA)0xff000000,
                                 (RGBA)*(deUint32 *)
                                        ((long)result.m_pixels.m_ptr +
                                        (long)(iVar9 * result.m_width + iVar15) * 4),local_294);
              if (bVar5) goto LAB_00592da2;
            }
          }
          iVar10 = iVar10 + 1;
        }
LAB_00592da2:
        iVar15 = local_21c + 1;
        uVar13 = (ulong)local_218;
        a.m_value = local_220;
        iVar6 = local_214;
      }
      iVar6 = iVar6 + (uint)(byte)((local_2a2 & ((a.m_value & 0xff0000) == 0 | bVar14) | local_2a3)
                                  ^ 1);
      uVar13 = CONCAT71((int7)(uVar13 >> 8),(byte)uVar13 | local_2a3);
      iVar10 = local_298 + 1;
    }
  }
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = local_290;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Found ");
  std::ostream::operator<<(poVar1,iVar15);
  std::operator<<((ostream *)poVar1,
                  " pixels with non-zero derivate (neighbor sample has gl_HelperInvocation = true)")
  ;
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (iVar6 < 1) {
    if ((uVar13 & 1) != 0) {
      poVar1 = &local_1b0.m_str;
      local_1b0.m_log = local_290;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"All result pixels are valid");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      goto LAB_00593066;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"Result",&local_2a4);
    pTVar2 = local_290;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"Result image",&local_2a1);
    pSVar11 = &result;
    tcu::LogImage::LogImage
              ((LogImage *)&local_1b0,&local_240,&local_260,pSVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&local_1b0,(int)pTVar2,__buf_00,(size_t)pSVar11);
    tcu::LogImage::~LogImage((LogImage *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_240);
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,"ERROR: Result image was empty!");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"Result",&local_2a4);
    pTVar2 = local_290;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"Result image",&local_2a1);
    pSVar11 = &result;
    tcu::LogImage::LogImage
              ((LogImage *)&local_1b0,&local_240,&local_260,pSVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&local_1b0,(int)pTVar2,__buf,(size_t)pSVar11);
    tcu::LogImage::~LogImage((LogImage *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_240);
    local_1b0.m_log = pTVar2;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"ERROR: Found ");
    std::ostream::operator<<(poVar1,iVar6);
    std::operator<<((ostream *)poVar1," invalid result pixels!");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  tcu::TestContext::setTestResult
            ((local_2a0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL
             ,"Invalid pixels found");
LAB_00593066:
  iVar15 = *local_208;
  *local_208 = iVar15 + 1;
  iVar6 = *local_200;
  tcu::Surface::~Surface(&result);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&sectionName);
  return (IterateResult)(iVar15 + 1 < iVar6);
}

Assistant:

HelperInvocationDerivateCase::IterateResult HelperInvocationDerivateCase::iterate (void)
{
	const glu::RenderContext&		renderCtx	= m_context.getRenderContext();
	const glw::Functions&			gl			= renderCtx.getFunctions();
	const string					sectionName	= string("Iteration ") + de::toString(m_iterNdx+1) + " / " + de::toString(m_numIters);
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), (string("Iter") + de::toString(m_iterNdx)), sectionName);
	de::Random						rnd			(deStringHash(getName()) ^ deInt32Hash(m_iterNdx));
	tcu::Surface					result		(FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT);

	m_fbo->bindForRendering();
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	drawRandomPrimitives(renderCtx, m_program->getProgram(), m_primitiveType, 1, &rnd);

	m_fbo->readPixels(0, 0, result.getAccess());

	if (!verifyHelperInvocationDerivate(m_testCtx.getLog(), result, m_numSamples != 0))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid pixels found");

	m_iterNdx += 1;
	return (m_iterNdx < m_numIters) ? CONTINUE : STOP;
}